

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

bool cppcms::xss::integer_property_functor(char *begin,char *end)

{
  char cVar1;
  bool bVar2;
  
  if (begin != end) {
    begin = begin + (*begin == '-');
  }
  if (begin != end) {
    do {
      bVar2 = begin == end;
      if (bVar2) {
        return bVar2;
      }
      cVar1 = *begin;
      begin = begin + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    return bVar2;
  }
  return false;
}

Assistant:

bool integer_property_functor(char const *begin,char const *end) 
	{
		if(begin!=end && *begin=='-')
			begin++;
		if(begin==end)
			return false;
		while(begin!=end) {
			char c= *begin++;
			if(c<'0' || '9'<c)
				return false;
		}
		return true;
	}